

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O1

void __thiscall duckdb::TemporaryFileManager::~TemporaryFileManager(TemporaryFileManager *this)

{
  temporary_buffer_size_map_t<temporary_file_map_t> *this_00;
  pointer pcVar1;
  long lVar2;
  
  this_00 = &(this->files).files;
  ::std::
  _Hashtable<duckdb::TemporaryBufferSize,_std::pair<const_duckdb::TemporaryBufferSize,_std::unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>_>_>_>_>,_std::allocator<std::pair<const_duckdb::TemporaryBufferSize,_std::unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TemporaryBufferSize>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&this_00->_M_h);
  lVar2 = 0x1aa8;
  do {
    RandomEngine::~RandomEngine((RandomEngine *)((long)&this->db + lVar2));
    lVar2 = lVar2 + -0x68;
  } while (lVar2 != 0xa8);
  ::std::
  _Hashtable<duckdb::TemporaryBufferSize,_std::pair<const_duckdb::TemporaryBufferSize,_duckdb::BlockIndexManager>,_std::allocator<std::pair<const_duckdb::TemporaryBufferSize,_duckdb::BlockIndexManager>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TemporaryBufferSize>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->index_managers)._M_h);
  ::std::
  _Hashtable<long,_std::pair<const_long,_duckdb::TemporaryFileIndex>,_std::allocator<std::pair<const_long,_duckdb::TemporaryFileIndex>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->used_blocks)._M_h);
  ::std::
  _Hashtable<duckdb::TemporaryBufferSize,_std::pair<const_duckdb::TemporaryBufferSize,_std::unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>_>_>_>_>,_std::allocator<std::pair<const_duckdb::TemporaryBufferSize,_std::unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TemporaryBufferSize>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&this_00->_M_h);
  pcVar1 = (this->temp_directory)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->temp_directory).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

TemporaryFileManager::~TemporaryFileManager() {
	files.Clear();
}